

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping_padding.cpp
# Opt level: O3

void test_2d_dynamic<1ul,5ul,1ul,0ul,30ul,30ul>(void)

{
  int ****ppppiVar1;
  undefined8 uVar2;
  long lVar3;
  char *t;
  ulong uVar4;
  int *****pppppiVar5;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  int ****local_88;
  int ****local_80;
  int ****local_78;
  ulong local_70;
  vector<int,_std::allocator<int>_> local_68;
  int ****local_50;
  ulong local_48;
  int *local_40;
  int ****local_38;
  
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_78 = (int ****)CONCAT71(local_78._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xaf,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(bool *)&local_68,(bool *)&local_78);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_78._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb1,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_68,(int *)&local_78);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_78 = (int ****)CONCAT44(local_78._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb2,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_68,(int *)&local_78);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x384;
  local_78 = (int ****)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb4,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_68,(unsigned_long *)&local_78);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_000003a2;
  local_78 = (int ****)0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb5,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_68,(unsigned_long *)&local_78);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_78 = (int ****)CONCAT71(local_78._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xbd,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(bool *)&local_68,(bool *)&local_78);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_78 = (int ****)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xbf,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_68,(unsigned_long *)&local_78);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x5;
  local_78 = (int ****)0x5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xc0,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_68,(unsigned_long *)&local_78);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0xb4;
  local_78 = (int ****)0xb4;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xc2,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_68,(unsigned_long *)&local_78);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_000003a2;
  local_78 = (int ****)0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xc3,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_68,(unsigned_long *)&local_78);
  local_78 = (int ****)CONCAT44(local_78._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_68,0x3a2,(value_type_conflict1 *)&local_78,(allocator_type *)&local_88);
  local_70 = 0;
  local_38 = (int ****)
             local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_80 = (int ****)0x0;
  pppppiVar5 = (int *****)
               local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
  do {
    lVar3 = 0;
    local_50 = (int ****)pppppiVar5;
    local_48 = local_70;
    while( true ) {
      t = (char *)((long)local_80 + lVar3);
      local_88 = (int ****)t;
      local_78 = (int ****)t;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xd1,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_88,(unsigned_long *)&local_78);
      local_40 = (int *)((long)local_38 + (long)local_78 * 4);
      local_88 = (int ****)pppppiVar5;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xd3,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_88,&local_40);
      if (lVar3 == 900) break;
      lVar3 = lVar3 + 0x1e;
      pppppiVar5 = pppppiVar5 + 0xf;
      local_70 = local_70 - 0x78;
    }
    *(undefined4 *)pppppiVar5 = 0x11;
    local_88._0_4_ = 0x11;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
               ,0xda,
               "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
               ,(int *)pppppiVar5,(int *)&local_88);
    if ((int *****)
        ((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start >> 2) <= t) goto LAB_001078ce;
    local_88 = (int ****)CONCAT44(local_88._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(data.at(l.index(i, j)))","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
               ,0xdd,
               "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
               ,(int *)((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start - local_70),(int *)&local_88);
    local_80 = (int ****)((long)local_80 + 1);
    pppppiVar5 = (int *****)((long)local_50 + 4);
    local_70 = local_48 - 4;
  } while ((int *****)local_80 != (int *****)0x1e);
  uVar4 = 0;
  t = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
  ;
  local_70 = 0;
  local_50 = (int ****)0x0;
  do {
    lVar3 = 0;
    local_48 = uVar4;
    do {
      local_88 = (int ****)(local_70 + lVar3);
      pppppiVar5 = &local_88;
      local_80 = local_88;
      local_78 = local_88;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xf4,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)pppppiVar5,(unsigned_long *)&local_78);
      ppppiVar1 = (int ****)((long)local_38 + uVar4);
      local_40 = (int *)((long)local_38 + (long)local_78 * 4);
      local_88 = ppppiVar1;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xf6,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(int **)pppppiVar5,&local_40);
      *(int *)ppppiVar1 = 0x47;
      local_88._0_4_ = 0x47;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xfa,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(int *)ppppiVar1,(int *)pppppiVar5);
      if ((int *****)
          ((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2) <= local_80) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_001078bd;
      }
      local_88 = (int ****)CONCAT44(local_88._4_4_,0x47);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(sub_l.index(i, j)))","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xfd,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(int *)((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + uVar4),(int *)&local_88);
      lVar3 = lVar3 + 0x1e;
      uVar4 = uVar4 + 0x78;
    } while (lVar3 != 900);
    local_50 = (int ****)((long)local_50 + 1);
    local_70 = local_70 + 5;
    uVar4 = local_48 + 0x14;
  } while ((int *****)local_50 != (int *****)0x6);
  pppppiVar5 = (int *****)0x0;
  uVar4 = 0;
  t = (char *)&local_88;
  while( true ) {
    local_48 = CONCAT44(local_48._4_4_,(int)uVar4 + (int)((uVar4 & 0xffffffff) / 5) * -5);
    lVar3 = 0;
    local_80 = (int ****)pppppiVar5;
    local_70 = uVar4;
    local_50 = (int ****)pppppiVar5;
    while( true ) {
      pppppiVar5 = (int *****)(local_70 + lVar3);
      local_88 = (int ****)pppppiVar5;
      local_78 = (int ****)pppppiVar5;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x106,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)t,(unsigned_long *)&local_78);
      ppppiVar1 = (int ****)((long)local_38 + (long)local_80);
      local_40 = (int *)((long)local_38 + (long)local_78 * 4);
      local_88 = ppppiVar1;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x108,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(int **)t,&local_40);
      if (lVar3 == 900) break;
      if ((int)local_48 == 0) {
        local_88._0_4_ = 0x47;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","71",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x124,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,(int *)ppppiVar1,(int *)t);
        if ((int *****)
            ((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2) <= pppppiVar5) goto LAB_001078bd;
        local_88 = (int ****)CONCAT44(local_88._4_4_,0x47);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","71",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x127,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + (long)local_80),(int *)t);
      }
      else {
        local_88._0_4_ = 0x2a;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,300,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,(int *)ppppiVar1,(int *)t);
        if ((int *****)
            ((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2) <= pppppiVar5) goto LAB_001078bd;
        local_88 = (int ****)CONCAT44(local_88._4_4_,0x2a);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x12f,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + (long)local_80),(int *)t);
      }
      lVar3 = lVar3 + 0x1e;
      local_80 = local_80 + 0xf;
    }
    local_88._0_4_ = 0x11;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
               ,0x10d,
               "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
               ,(int *)ppppiVar1,(int *)t);
    if ((int *****)
        ((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start >> 2) <= pppppiVar5) break;
    local_88 = (int ****)CONCAT44(local_88._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(data.at(l.index(i, j)))","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
               ,0x110,
               "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
               ,(int *)((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + (long)local_80),(int *)t);
    uVar4 = local_70 + 1;
    pppppiVar5 = (int *****)((long)local_50 + 4);
    if (uVar4 == 0x1e) {
      if ((int *****)
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *****)0x0) {
        operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  }
LAB_001078bd:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pppppiVar5)
  ;
LAB_001078ce:
  uVar2 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",t);
  if ((int *****)
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *****)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const l{{X, Y}, {1, 1}, {PadX, PadY}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_right<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const sub_l{{X / StepX, Y / StepY}, {StepX, StepY}, {PadX, PadY}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    // Initialize all elements to 42.
    std::vector<int> data(
        (l[0] + l.padding()[0]) * (l[1] + l.padding()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.padding();
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1] + p[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i, j))), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.stepping()[0]))
               && (0 == (j % sub_l.stepping()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 42);
            }
        }
    }
}